

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O0

size_t __thiscall proto3_unittest::TestUnpackedTypes::ByteSizeLong(TestUnpackedTypes *this)

{
  int iVar1;
  RepeatedField<int> *pRVar2;
  size_t sVar3;
  size_t sVar4;
  RepeatedField<long> *pRVar5;
  size_t sVar6;
  size_t sVar7;
  RepeatedField<unsigned_int> *value;
  size_t sVar8;
  size_t sVar9;
  RepeatedField<unsigned_long> *value_00;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  size_t sVar25;
  size_t sVar26;
  size_t sVar27;
  size_t sVar28;
  size_t sVar29;
  size_t sVar30;
  size_t sVar31;
  size_t tag_size_13;
  size_t data_size_13;
  size_t tag_size_12;
  size_t data_size_12;
  size_t tag_size_11;
  size_t data_size_11;
  size_t tag_size_10;
  size_t data_size_10;
  size_t tag_size_9;
  size_t data_size_9;
  size_t tag_size_8;
  size_t data_size_8;
  size_t tag_size_7;
  size_t data_size_7;
  size_t tag_size_6;
  size_t data_size_6;
  size_t tag_size_5;
  size_t data_size_5;
  size_t tag_size_4;
  size_t data_size_4;
  size_t tag_size_3;
  size_t data_size_3;
  size_t tag_size_2;
  size_t data_size_2;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  uint32_t cached_has_bits;
  size_t total_size;
  TestUnpackedTypes *this_;
  TestUnpackedTypes *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar2 = _internal_repeated_int32(this);
  sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(pRVar2);
  iVar1 = _internal_repeated_int32_size(this);
  sVar4 = google::protobuf::internal::FromIntSize(iVar1);
  pRVar5 = _internal_repeated_int64(this);
  sVar6 = google::protobuf::internal::WireFormatLite::Int64Size(pRVar5);
  iVar1 = _internal_repeated_int64_size(this);
  sVar7 = google::protobuf::internal::FromIntSize(iVar1);
  value = _internal_repeated_uint32(this);
  sVar8 = google::protobuf::internal::WireFormatLite::UInt32Size(value);
  iVar1 = _internal_repeated_uint32_size(this);
  sVar9 = google::protobuf::internal::FromIntSize(iVar1);
  value_00 = _internal_repeated_uint64(this);
  sVar10 = google::protobuf::internal::WireFormatLite::UInt64Size(value_00);
  iVar1 = _internal_repeated_uint64_size(this);
  sVar11 = google::protobuf::internal::FromIntSize(iVar1);
  pRVar2 = _internal_repeated_sint32(this);
  sVar12 = google::protobuf::internal::WireFormatLite::SInt32Size(pRVar2);
  iVar1 = _internal_repeated_sint32_size(this);
  sVar13 = google::protobuf::internal::FromIntSize(iVar1);
  pRVar5 = _internal_repeated_sint64(this);
  sVar14 = google::protobuf::internal::WireFormatLite::SInt64Size(pRVar5);
  iVar1 = _internal_repeated_sint64_size(this);
  sVar15 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_fixed32_size(this);
  sVar16 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_fixed32_size(this);
  sVar17 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_fixed64_size(this);
  sVar18 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_fixed64_size(this);
  sVar19 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_sfixed32_size(this);
  sVar20 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_sfixed32_size(this);
  sVar21 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_sfixed64_size(this);
  sVar22 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_sfixed64_size(this);
  sVar23 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_float_size(this);
  sVar24 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_float_size(this);
  sVar25 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_double_size(this);
  sVar26 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_double_size(this);
  sVar27 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_bool_size(this);
  sVar28 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_repeated_bool_size(this);
  sVar29 = google::protobuf::internal::FromIntSize(iVar1);
  pRVar2 = _internal_repeated_nested_enum(this);
  sVar30 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar2);
  iVar1 = _internal_repeated_nested_enum_size(this);
  sVar31 = google::protobuf::internal::FromIntSize(iVar1);
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,
                     sVar30 + sVar31 +
                     sVar29 + sVar28 +
                     sVar27 + sVar26 * 8 +
                     sVar25 + sVar24 * 4 +
                     sVar23 + sVar22 * 8 +
                     sVar21 + sVar20 * 4 +
                     sVar19 + sVar18 * 8 +
                     sVar17 + sVar16 * 4 +
                     sVar15 + sVar14 +
                     sVar13 + sVar12 +
                     sVar11 + sVar10 + sVar9 + sVar8 + sVar7 + sVar6 + sVar4 + sVar3,
                     &(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestUnpackedTypes::ByteSizeLong() const {
  const TestUnpackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_unittest.TestUnpackedTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 1 [packed = false];
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_repeated_int32());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_int32_size());
      total_size += tag_size + data_size;
    }
    // repeated int64 repeated_int64 = 2 [packed = false];
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int64Size(
          this_._internal_repeated_int64());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_int64_size());
      total_size += tag_size + data_size;
    }
    // repeated uint32 repeated_uint32 = 3 [packed = false];
    {
      ::size_t data_size = ::_pbi::WireFormatLite::UInt32Size(
          this_._internal_repeated_uint32());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_uint32_size());
      total_size += tag_size + data_size;
    }
    // repeated uint64 repeated_uint64 = 4 [packed = false];
    {
      ::size_t data_size = ::_pbi::WireFormatLite::UInt64Size(
          this_._internal_repeated_uint64());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_uint64_size());
      total_size += tag_size + data_size;
    }
    // repeated sint32 repeated_sint32 = 5 [packed = false];
    {
      ::size_t data_size = ::_pbi::WireFormatLite::SInt32Size(
          this_._internal_repeated_sint32());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_sint32_size());
      total_size += tag_size + data_size;
    }
    // repeated sint64 repeated_sint64 = 6 [packed = false];
    {
      ::size_t data_size = ::_pbi::WireFormatLite::SInt64Size(
          this_._internal_repeated_sint64());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_sint64_size());
      total_size += tag_size + data_size;
    }
    // repeated fixed32 repeated_fixed32 = 7 [packed = false];
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      total_size += tag_size + data_size;
    }
    // repeated fixed64 repeated_fixed64 = 8 [packed = false];
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed64_size());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed64_size());
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 repeated_sfixed32 = 9 [packed = false];
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed32_size());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed32_size());
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 repeated_sfixed64 = 10 [packed = false];
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed64_size());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed64_size());
      total_size += tag_size + data_size;
    }
    // repeated float repeated_float = 11 [packed = false];
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_size());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_size());
      total_size += tag_size + data_size;
    }
    // repeated double repeated_double = 12 [packed = false];
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_size());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_size());
      total_size += tag_size + data_size;
    }
    // repeated bool repeated_bool = 13 [packed = false];
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_size());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_size());
      total_size += tag_size + data_size;
    }
    // repeated .proto3_unittest.TestAllTypes.NestedEnum repeated_nested_enum = 14 [packed = false];
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_nested_enum());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_nested_enum_size());
      total_size += data_size + tag_size;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}